

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_extension.cpp
# Opt level: O3

int __thiscall
mwheel::test::PluginExtension::clone
          (PluginExtension *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0010aba8;
  puVar1[3] = 10;
  puVar1[2] = &PTR_get_0010ab30;
  *(undefined8 **)this = puVar1 + 2;
  *(undefined8 **)&this->m_int = puVar1;
  return (int)this;
}

Assistant:

ClientInterface::clone_type PluginExtension::clone() { return make_shared<PluginExtension>(); }